

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper
          (QSharedDataPointer<QStyleSheetBackgroundData> *this)

{
  QStyleSheetBackgroundData *pQVar1;
  Alignment AVar2;
  Origin OVar3;
  Attachment AVar4;
  QStyleSheetBackgroundData *pQVar5;
  
  pQVar5 = (QStyleSheetBackgroundData *)operator_new(0x40);
  pQVar1 = (this->d).ptr;
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QBrush::QBrush(&pQVar5->brush,&pQVar1->brush);
  QPixmap::QPixmap(&pQVar5->pixmap,&pQVar1->pixmap);
  pQVar5->clip = pQVar1->clip;
  AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (pQVar1->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
  OVar3 = pQVar1->origin;
  AVar4 = pQVar1->attachment;
  pQVar5->repeat = pQVar1->repeat;
  pQVar5->position =
       (Alignment)
       AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.
       i;
  pQVar5->origin = OVar3;
  pQVar5->attachment = AVar4;
  LOCK();
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QStyleSheetBackgroundData *)0x0) {
      QPixmap::~QPixmap(&pQVar1->pixmap);
      QBrush::~QBrush(&pQVar1->brush);
    }
    operator_delete(pQVar1,0x40);
  }
  (this->d).ptr = pQVar5;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}